

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O3

int ffibin(fitsfile *fptr,LONGLONG naxis2,int tfields,char **ttype,char **tform,char **tunit,
          char *extnmx,LONGLONG pcount,int *status)

{
  int iVar1;
  int iVar2;
  LONGLONG LVar3;
  LONGLONG *pLVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  FITSfile *pFVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  int datacode;
  char **local_f0;
  ulong local_e8;
  long width;
  char extnm [71];
  long repeat;
  
  iVar9 = *status;
  if (iVar9 < 1) {
    uVar11 = (ulong)(uint)tfields;
    extnm[0] = '\0';
    if (extnmx != (char *)0x0) {
      strncat(extnm,extnmx,0x46);
    }
    iVar9 = fptr->HDUposition;
    pFVar8 = fptr->Fptr;
    if (iVar9 != pFVar8->curhdu) {
      ffmahd(fptr,iVar9 + 1,(int *)0x0,status);
      pFVar8 = fptr->Fptr;
      iVar9 = pFVar8->curhdu;
    }
    if ((pFVar8->headend == pFVar8->headstart[iVar9]) ||
       ((iVar9 == pFVar8->maxhdu && (pFVar8->logfilesize <= pFVar8->headstart[(long)iVar9 + 1])))) {
      ffcrtb(fptr,2,naxis2,tfields,ttype,tform,tunit,extnm,status);
      iVar9 = *status;
    }
    else if (naxis2 < 0) {
      *status = 0xda;
      iVar9 = 0xda;
    }
    else if ((uint)tfields < 1000) {
      if (tfields == 0) {
        iVar9 = 0;
      }
      else {
        uVar10 = 0;
        iVar9 = 0;
        do {
          if ((tunit != (char **)0x0) && (*tunit != (char *)0x0)) {
            iVar9 = (iVar9 + 1) - (uint)(*tunit[uVar10] == '\0');
          }
          uVar10 = uVar10 + 1;
        } while ((uint)tfields != uVar10);
      }
      bVar13 = extnm[0] == '\0';
      local_f0 = ttype;
      local_e8 = uVar11;
      if (tfields == 0) {
        lVar12 = 0;
      }
      else {
        uVar11 = 0;
        lVar12 = 0;
        do {
          ffbnfm(tform[uVar11],&datacode,&repeat,&width,status);
          lVar7 = repeat;
          if (datacode != 0x10) {
            if (datacode == 1) {
              lVar7 = repeat + 0xe;
              if (-1 < repeat + 7) {
                lVar7 = repeat + 7;
              }
              lVar7 = lVar7 >> 3;
            }
            else {
              lVar7 = repeat * width;
            }
          }
          lVar12 = lVar12 + lVar7;
          uVar11 = uVar11 + 1;
        } while ((uint)tfields != uVar11);
        pFVar8 = fptr->Fptr;
      }
      if (pFVar8->writemode == 1) {
        iVar5 = (int)(((iVar9 + tfields * 2) - (uint)bVar13) + 0x2d) / 0x24;
        ffrdef(fptr,status);
        ffpdfl(fptr,status);
        pFVar8 = fptr->Fptr;
        iVar9 = pFVar8->curhdu;
        LVar3 = pFVar8->headstart[(long)iVar9 + 1];
        pFVar8->hdutype = 2;
        iVar6 = ffiblk(fptr,(long)iVar5 + (pcount + lVar12 * naxis2 + 0xb3f) / 0xb40,1,status);
        if (iVar6 < 1) {
          pFVar8 = fptr->Fptr;
          iVar1 = pFVar8->maxhdu;
          iVar6 = iVar1 + 1;
          pFVar8->maxhdu = iVar6;
          iVar2 = pFVar8->curhdu;
          pLVar4 = pFVar8->headstart;
          if (iVar2 <= iVar1) {
            lVar12 = (long)iVar6;
            do {
              pLVar4[lVar12 + 1] = pLVar4[lVar12];
              lVar12 = lVar12 + -1;
            } while (iVar2 < lVar12);
          }
          pLVar4[(long)iVar9 + 1] = LVar3;
          pFVar8->curhdu = iVar9 + 1;
          fptr->HDUposition = iVar9 + 1;
          pFVar8->nextkey = LVar3;
          lVar12 = pLVar4[(long)iVar9 + 1];
          pFVar8->headend = lVar12;
          pFVar8->datastart = iVar5 * 0xb40 + lVar12;
          pFVar8->hdutype = 2;
          ffphbn(fptr,naxis2,(int)local_e8,local_f0,tform,tunit,extnm,pcount,status);
          ffrdef(fptr,status);
        }
        iVar9 = *status;
      }
      else {
        *status = 0x70;
        iVar9 = 0x70;
      }
    }
    else {
      snprintf((char *)&repeat,0x51,"Illegal value for TFIELDS keyword: %d",uVar11);
      ffpmsg((char *)&repeat);
      *status = 0xd8;
      iVar9 = 0xd8;
    }
  }
  return iVar9;
}

Assistant:

int ffibin(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG naxis2,     /* I - number of rows in the table              */
           int tfields,     /* I - number of columns in the table           */
           char **ttype,    /* I - name of each column                      */
           char **tform,    /* I - value of TFORMn keyword for each column  */
           char **tunit,    /* I - value of TUNITn keyword for each column  */
           const char *extnmx,     /* I - value of EXTNAME keyword, if any         */
           LONGLONG pcount, /* I - size of special data area (heap)         */
           int *status)     /* IO - error status                            */
/*
  insert a Binary table extension following the current HDU 
*/
{
    int nexthdu, maxhdu, ii, nunit, nhead, datacode;
    LONGLONG naxis1;
    long nblocks, repeat, width;
    LONGLONG datasize, newstart;
    char errmsg[FLEN_ERRMSG], extnm[FLEN_VALUE];

    if (*status > 0)
        return(*status);

    extnm[0] = '\0';
    if (extnmx)
      strncat(extnm, extnmx, FLEN_VALUE-1);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    maxhdu = (fptr->Fptr)->maxhdu;
    /* if the current header is completely empty ...  */
    if (( (fptr->Fptr)->headend == (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        /* or, if we are at the end of the file, ... */
    ||  ( (((fptr->Fptr)->curhdu) == maxhdu ) &&
       ((fptr->Fptr)->headstart[maxhdu + 1] >= (fptr->Fptr)->logfilesize ) ) )
    {
        /* then simply append new image extension */
        ffcrtb(fptr, BINARY_TBL, naxis2, tfields, ttype, tform, tunit,
               extnm, status);
        return(*status);
    }

    if (naxis2 < 0)
        return(*status = NEG_ROWS);
    else if (tfields < 0 || tfields > 999)
    {
        snprintf(errmsg, FLEN_ERRMSG,
        "Illegal value for TFIELDS keyword: %d", tfields);
        ffpmsg(errmsg);
        return(*status = BAD_TFIELDS);
    }

    /* count number of optional TUNIT keywords to be written */
    nunit = 0;
    for (ii = 0; ii < tfields; ii++)
    {
        if (tunit && *tunit && *tunit[ii])
            nunit++;
    }

    if (*extnm)
         nunit++;     /* add one for the EXTNAME keyword */

    nhead = (9 + (2 * tfields) + nunit + 35) / 36;  /* no. of header blocks */

    /* calculate total width of the table */
    naxis1 = 0;
    for (ii = 0; ii < tfields; ii++)
    {
        ffbnfm(tform[ii], &datacode, &repeat, &width, status);

        if (datacode == TBIT)
            naxis1 = naxis1 + ((repeat + 7) / 8);
        else if (datacode == TSTRING)
            naxis1 += repeat;
        else
            naxis1 = naxis1 + (repeat * width);
    }

    datasize = ((LONGLONG)naxis1 * naxis2) + pcount;         /* size of table in bytes */
    nblocks = (long) ((datasize + 2879) / 2880) + nhead;  /* size of HDU */

    if ((fptr->Fptr)->writemode == READWRITE) /* must have write access */
    {   /* close the CHDU */
        ffrdef(fptr, status);  /* scan header to redefine structure */
        ffpdfl(fptr, status);  /* insure correct data file values */
    }
    else
        return(*status = READONLY_FILE);

    nexthdu = ((fptr->Fptr)->curhdu) + 1; /* number of the next (new) hdu */
    newstart = (fptr->Fptr)->headstart[nexthdu]; /* save starting addr of HDU */

    (fptr->Fptr)->hdutype = BINARY_TBL;  /* so that correct fill value is used */

    /* ffiblk also increments headstart for all following HDUs */
    if (ffiblk(fptr, nblocks, 1, status) > 0)  /* insert the blocks */
        return(*status);

    ((fptr->Fptr)->maxhdu)++;      /* increment known number of HDUs in the file */
    for (ii = (fptr->Fptr)->maxhdu; ii > (fptr->Fptr)->curhdu; ii--)
        (fptr->Fptr)->headstart[ii + 1] = (fptr->Fptr)->headstart[ii]; /* incre start addr */

    (fptr->Fptr)->headstart[nexthdu] = newstart; /* set starting addr of HDU */

    /* set default parameters for this new empty HDU */
    (fptr->Fptr)->curhdu = nexthdu;   /* we are now located at the next HDU */
    fptr->HDUposition = nexthdu;      /* we are now located at the next HDU */
    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[nexthdu];  
    (fptr->Fptr)->headend = (fptr->Fptr)->headstart[nexthdu];
    (fptr->Fptr)->datastart = ((fptr->Fptr)->headstart[nexthdu]) + (nhead * 2880);
    (fptr->Fptr)->hdutype = BINARY_TBL;  /* might need to be reset... */

    /* write the required header keywords. This will write PCOUNT = 0 */
    /* so that the variable length data will be written at the right place */
    ffphbn(fptr, naxis2, tfields, ttype, tform, tunit, extnm, pcount,
           status);

    /* redefine internal structure for this HDU (with PCOUNT = 0) */
    ffrdef(fptr, status);

    return(*status);
}